

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationEntry.h
# Opt level: O0

void __thiscall cmDocumentationEntry::~cmDocumentationEntry(cmDocumentationEntry *this)

{
  cmDocumentationEntry *this_local;
  
  std::__cxx11::string::~string((string *)&this->Brief);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmDocumentationEntry(const std::string& name, const std::string& brief)
    : Name{ name }
    , Brief{ brief }
  {
  }